

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int read_VXR(coda_cdf_product *product_file,coda_cdf_variable *variable,int64_t offset,int32_t first
            ,int32_t last)

{
  uint uVar1;
  int64_t *piVar2;
  size_t sVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  char cVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int8_t *piVar14;
  Bytef *dst;
  bool bVar15;
  ushort uVar16;
  undefined8 uVar18;
  ulong uVar19;
  ushort uVar20;
  long lVar21;
  int iVar22;
  char *pcVar23;
  int32_t last_00;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int64_t vr_offset;
  int32_t vr_first;
  int32_t nused_entries;
  int32_t n_entries;
  int32_t record_type;
  int32_t record_type_1;
  int32_t vr_last;
  int64_t vxr_next;
  int64_t csize;
  ushort local_e8;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  undefined1 uStack_e4;
  undefined1 uStack_e3;
  ushort uStack_e2;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  ushort local_c8;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort local_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  size_t local_b8;
  Bytef *local_b0;
  long local_a8;
  z_stream local_a0;
  uint uVar17;
  
  uVar24 = (ulong)(uint)last;
  if (offset == 0) {
    iVar12 = 0;
  }
  else {
    iVar11 = read_bytes(product_file->raw_product,offset + 8,4,&local_d4);
    iVar12 = -1;
    if (-1 < iVar11) {
      uVar4 = (undefined1)local_d4;
      uVar9 = local_d4._1_2_ << 8;
      uVar10 = local_d4._1_2_ >> 8;
      local_d4 = CONCAT13(uVar4,CONCAT21(uVar9 | uVar10,local_d4._3_1_));
      if (local_d4 == 6) {
        iVar11 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_c8);
        if ((-1 < iVar11) &&
           (iVar11 = read_bytes(product_file->raw_product,offset + 0x14,4,&local_d8), -1 < iVar11))
        {
          iVar11 = read_bytes(product_file->raw_product,offset + 0x18,4,&local_dc);
          last_00 = (int32_t)uVar24;
          if (-1 < iVar11) {
            uVar9 = local_c8 << 8 | local_c8 >> 8;
            local_c8 = uStack_c2 << 8 | uStack_c2 >> 8;
            uVar20 = uStack_c6 << 8 | uStack_c6 >> 8;
            uStack_c6 = uStack_c4 << 8 | uStack_c4 >> 8;
            uVar10 = (ushort)local_d8 << 8 | (ushort)local_d8 >> 8;
            local_d8 = CONCAT22(uVar10,local_d8._2_2_ << 8 | local_d8._2_2_ >> 8);
            uVar16 = local_dc._2_2_ << 8 | local_dc._2_2_ >> 8;
            uVar17 = (uint)uVar16;
            local_dc = CONCAT22((ushort)local_dc << 8 | (ushort)local_dc >> 8,uVar16);
            uStack_c4 = uVar20;
            uStack_c2 = uVar9;
            if (((short)uVar9 < 0) ||
               (product_file->file_size <=
                CONCAT26(uVar9,CONCAT24(uVar20,CONCAT22(uStack_c6,local_c8))))) {
              pcVar23 = "CDF file has invalid offset for VXR record";
            }
            else {
              if (-1 < (short)uVar10) {
                if (0 < local_dc) {
                  lVar27 = offset + 0x1c;
                  lVar21 = 0;
                  do {
                    iVar12 = read_bytes(product_file->raw_product,lVar27 + lVar21 * 4,4,&local_e0);
                    if (iVar12 < 0) {
                      return -1;
                    }
                    lVar25 = (long)(int)lVar21 + (long)local_d8;
                    iVar12 = read_bytes(product_file->raw_product,lVar27 + lVar25 * 4,4,&local_cc);
                    if (iVar12 < 0) {
                      return -1;
                    }
                    iVar12 = read_bytes(product_file->raw_product,((int)lVar25 << 3) + lVar27,8,
                                        &local_e8);
                    uVar7 = uStack_e3;
                    uVar6 = uStack_e4;
                    uVar5 = uStack_e5;
                    uVar4 = uStack_e6;
                    if (iVar12 < 0) {
                      return -1;
                    }
                    cVar8 = (char)local_e0;
                    uVar9 = local_e0._1_2_ << 8;
                    uVar10 = local_e0._1_2_ >> 8;
                    local_e0 = CONCAT13(cVar8,CONCAT21(uVar9 | uVar10,local_e0._3_1_));
                    uVar17 = local_e0;
                    uVar9 = (ushort)local_cc << 8 | (ushort)local_cc >> 8;
                    uVar10 = local_e8 << 8 | local_e8 >> 8;
                    local_e8 = uStack_e2 << 8 | uStack_e2 >> 8;
                    local_cc = CONCAT22(uVar9,local_cc._2_2_ << 8 | local_cc._2_2_ >> 8);
                    iVar12 = local_cc;
                    uStack_e3 = uStack_e6;
                    uStack_e6 = uVar7;
                    uStack_e4 = uStack_e5;
                    uStack_e5 = uVar6;
                    uVar26 = (ulong)local_e0;
                    uStack_e2 = uVar10;
                    if (cVar8 < '\0') {
                      pcVar23 = "CDF file has invalid first record number in VXR record";
LAB_0014928c:
                      coda_set_error(-300,pcVar23);
                      return -1;
                    }
                    if ((short)uVar9 < 0) {
                      pcVar23 = "CDF file has invalid last record number in VXR record";
                      goto LAB_0014928c;
                    }
                    lVar25 = CONCAT26(uVar10,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,local_e8)))));
                    local_a8 = lVar21;
                    if (((short)uVar10 < 0) || (product_file->file_size <= lVar25)) {
                      pcVar23 = "CDF file has invalid offset for VR record";
                      goto LAB_0014928c;
                    }
                    iVar11 = 0;
                    if (lVar25 != 0) {
                      iVar13 = read_bytes(product_file->raw_product,lVar25 + 8,4,&local_d0);
                      iVar11 = -1;
                      if (-1 < iVar13) {
                        uVar4 = (undefined1)local_d0;
                        uVar18 = CONCAT71(0xffffff,local_d0._3_1_);
                        uVar9 = local_d0._1_2_ << 8;
                        uVar10 = local_d0._1_2_ >> 8;
                        local_d0 = CONCAT13(uVar4,CONCAT21(uVar9 | uVar10,local_d0._3_1_));
                        if (local_d0 == 0xd) {
                          if (variable->has_compression == 0) {
                            iVar12 = -0x16;
                            pcVar23 = "unexpected CVVR record for uncompressed CDF variable";
LAB_00148f2f:
                            coda_set_error(iVar12,pcVar23);
LAB_00148f36:
                            bVar15 = false;
                            iVar11 = -1;
                          }
                          else {
                            bVar15 = false;
                            iVar11 = 0;
                            if ((int)uVar17 < variable->num_records) {
                              if (variable->data == (int8_t *)0x0) {
                                local_b8 = (long)variable->value_size *
                                           (long)variable->num_values_per_record *
                                           (long)variable->num_records;
                                piVar14 = (int8_t *)malloc(local_b8);
                                variable->data = piVar14;
                                if (piVar14 != (int8_t *)0x0) goto LAB_00148e54;
                                uVar24 = 0x2c9;
                              }
                              else {
LAB_00148e54:
                                iVar11 = read_bytes(product_file->raw_product,lVar25 + 0x10,8,
                                                    &local_c0);
                                if (iVar11 < 0) {
LAB_0014920b:
                                  iVar11 = -1;
                                  bVar15 = false;
                                  goto LAB_00148f3d;
                                }
                                uVar9 = local_c0 << 8 | local_c0 >> 8;
                                local_c0 = uStack_ba << 8 | uStack_ba >> 8;
                                uVar10 = uStack_be << 8 | uStack_be >> 8;
                                uStack_be = uStack_bc << 8 | uStack_bc >> 8;
                                sVar3 = CONCAT26(uVar9,CONCAT24(uVar10,CONCAT22(uStack_be,local_c0))
                                                );
                                uStack_bc = uVar10;
                                uStack_ba = uVar9;
                                if ((long)sVar3 < 0x14) {
                                  iVar12 = -300;
                                  pcVar23 = "invalid compressed data block for CDF variable";
                                  goto LAB_00148f2f;
                                }
                                local_b8 = sVar3;
                                dst = (Bytef *)malloc(sVar3);
                                sVar3 = local_b8;
                                if (dst != (Bytef *)0x0) {
                                  local_b0 = dst;
                                  iVar11 = read_bytes(product_file->raw_product,lVar25 + 0x18,
                                                      local_b8,dst);
                                  if (-1 < iVar11) {
                                    local_a0.next_in = (Bytef *)0x0;
                                    local_a0.avail_in = 0;
                                    local_a0.msg = (char *)0x0;
                                    local_a0.opaque = (voidpf)0x0;
                                    local_a0.zalloc = (alloc_func)0x0;
                                    local_a0.zfree = (free_func)0x0;
                                    iVar11 = coda_inflateInit2_(&local_a0,0x1f,"1.3.1",0x70);
                                    if (iVar11 == 0) {
                                      local_a0.next_in = local_b0;
                                      local_a0.avail_in = (uInt)sVar3;
                                      uVar1 = variable->num_records;
                                      local_b8 = (size_t)uVar1;
                                      iVar13 = uVar1 - 1;
                                      if (iVar12 < (int)uVar1) {
                                        iVar13 = iVar12;
                                      }
                                      iVar11 = variable->value_size *
                                               variable->num_values_per_record;
                                      local_a0.avail_out = ((iVar13 - uVar17) + 1) * iVar11;
                                      uVar19 = (ulong)local_a0.avail_out;
                                      local_a0.next_out =
                                           (Bytef *)(variable->data + (int)(iVar11 * uVar17));
                                      iVar11 = coda_inflate(&local_a0,4);
                                      if (iVar11 == -2) {
                                        __assert_fail("result != Z_STREAM_ERROR",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                                  ,0x303,
                                                  "int read_VR(coda_cdf_product *, coda_cdf_variable *, int64_t, int32_t, int32_t)"
                                                  );
                                      }
                                      bVar15 = (int)local_b8 <= iVar12;
                                      if ((-1 < iVar11) || (bVar15 = bVar15 && iVar11 == -5, bVar15)
                                         ) {
                                        iVar11 = (int)CONCAT71((int7)(uVar19 >> 8),bVar15);
                                        free(local_b0);
                                        iVar12 = coda_inflateEnd(&local_a0);
                                        if (iVar12 == 0) {
                                          if ((int)uVar17 <= iVar13) {
                                            iVar12 = variable->num_values_per_record *
                                                     variable->value_size;
                                            piVar2 = variable->offset;
                                            iVar11 = iVar12 * uVar17;
                                            lVar21 = 0;
                                            do {
                                              piVar2[uVar26 + lVar21] = (long)iVar11;
                                              iVar11 = iVar11 + iVar12;
                                              lVar21 = lVar21 + 1;
                                            } while ((iVar13 - uVar17) + 1 != (int)lVar21);
                                          }
                                          bVar15 = true;
                                          goto LAB_00148f3d;
                                        }
                                        coda_set_error(-0x16,"zlib error");
                                        if (local_a0.msg == (char *)0x0) goto LAB_0014920b;
                                        coda_add_error_message(" (%s)");
                                        goto LAB_00148f36;
                                      }
                                      if (iVar11 == -4) {
                                        coda_set_error(-1,(char *)0x0);
                                      }
                                      else {
                                        if ((iVar11 == 2) || (iVar11 == -3)) {
                                          pcVar23 = 
                                          "invalid or incomplete compressed data for CDF variable";
                                        }
                                        else {
                                          pcVar23 = "error during decompression of CDF variable";
                                        }
                                        coda_set_error(-0x16,pcVar23);
                                        if (local_a0.msg != (char *)0x0) {
                                          coda_add_error_message(" (%s)");
                                        }
                                      }
                                      coda_inflateEnd(&local_a0);
                                    }
                                    else {
                                      coda_set_error(-0x16,"could not intialize zip decompression");
                                      if (local_a0.msg != (char *)0x0) {
                                        coda_add_error_message(" (%s)");
                                      }
                                    }
                                  }
                                  free(local_b0);
                                  goto LAB_00148f36;
                                }
                                uVar24 = 0x2e0;
                              }
                              coda_set_error(-1,
                                             "out of memory (could not allocate %lu bytes) (%s:%u)",
                                             local_b8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                            );
                              goto LAB_00148f36;
                            }
                          }
LAB_00148f3d:
                          if (!bVar15) goto LAB_00148f43;
                        }
                        else {
                          if (local_d0 != 7) {
                            if (local_d0 == 6) {
                              iVar11 = read_VXR(product_file,variable,lVar25,(int32_t)uVar18,
                                                (int32_t)uVar24);
                            }
                            else {
                              coda_set_error(-300,
                                             "CDF file has invalid record type (%d) for VVR record")
                              ;
LAB_00148ee0:
                              iVar11 = -1;
                            }
                            goto LAB_00148f43;
                          }
                          iVar11 = variable->num_records;
                          iVar13 = iVar11 + -1;
                          if (iVar12 < iVar11) {
                            iVar13 = iVar12;
                          }
                          if (variable->has_compression == 0) {
                            if ((int)uVar17 <= iVar13) {
                              iVar12 = variable->num_values_per_record;
                              iVar11 = variable->value_size;
                              piVar2 = variable->offset;
                              lVar21 = 0;
                              iVar22 = 0;
                              do {
                                piVar2[uVar26 + lVar21] = (long)iVar22 + lVar25 + 0xc;
                                iVar22 = iVar22 + iVar12 * iVar11;
                                lVar21 = lVar21 + 1;
                              } while ((iVar13 - uVar17) + 1 != (int)lVar21);
                            }
                          }
                          else {
                            if (variable->data == (int8_t *)0x0) {
                              local_b8 = (long)variable->value_size *
                                         (long)variable->num_values_per_record * (long)iVar11;
                              piVar14 = (int8_t *)malloc(local_b8);
                              variable->data = piVar14;
                              if (piVar14 == (int8_t *)0x0) {
                                uVar24 = 0x295;
                                coda_set_error(-1,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)"
                                               ,local_b8,
                                               "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                              );
                                goto LAB_00148ee0;
                              }
                            }
                            iVar12 = variable->value_size * variable->num_values_per_record;
                            iVar12 = read_bytes(product_file->raw_product,lVar25 + 0xc,
                                                (long)(int)(((iVar13 - uVar17) + 1) * iVar12),
                                                variable->data + (int)(iVar12 * uVar17));
                            iVar11 = -1;
                            if (iVar12 < 0) goto LAB_00148f43;
                            if ((int)uVar17 <= iVar13) {
                              iVar12 = variable->num_values_per_record * variable->value_size;
                              piVar2 = variable->offset;
                              iVar11 = iVar12 * uVar17;
                              lVar21 = 0;
                              do {
                                piVar2[uVar26 + lVar21] = (long)iVar11;
                                iVar11 = iVar11 + iVar12;
                                lVar21 = lVar21 + 1;
                              } while ((iVar13 - uVar17) + 1 != (int)lVar21);
                            }
                          }
                        }
                        iVar11 = 0;
                      }
                    }
LAB_00148f43:
                    last_00 = (int32_t)uVar24;
                    if (iVar11 != 0) {
                      return -1;
                    }
                    lVar21 = local_a8 + 1;
                  } while (lVar21 < local_dc);
                  uVar17 = 0;
                }
                iVar12 = read_VXR(product_file,variable,
                                  CONCAT26(uStack_c2,
                                           CONCAT24(uStack_c4,CONCAT22(uStack_c6,local_c8))),uVar17,
                                  last_00);
                return -(uint)(iVar12 != 0);
              }
              pcVar23 = "CDF file has invalid number of entries for VXR record";
            }
            coda_set_error(-300,pcVar23);
          }
        }
      }
      else {
        coda_set_error(-300,"CDF file has invalid record type (%d) for VXR record");
      }
    }
  }
  return iVar12;
}

Assistant:

static int read_VXR(coda_cdf_product *product_file, coda_cdf_variable *variable, int64_t offset, int32_t first,
                    int32_t last)
{
    int32_t record_type;
    int64_t vxr_next;
    int32_t n_entries;
    int32_t nused_entries;
    int i;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 6)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for VXR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &vxr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &n_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &nused_entries) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&vxr_next);
    swap_int32(&n_entries);
    swap_int32(&nused_entries);
#endif
    offset += 28;
    if (vxr_next < 0 || vxr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (n_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of entries for VXR record");
        return -1;
    }

    for (i = 0; i < nused_entries; i++)
    {
        int32_t vr_first;
        int32_t vr_last;
        int64_t vr_offset;

        if (read_bytes(product_file->raw_product, offset + i * 4, 4, &vr_first) < 0)
        {
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset + (i + n_entries) * 4, 4, &vr_last) < 0)
        {
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset + (i + n_entries) * 8, 8, &vr_offset) < 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&vr_first);
        swap_int32(&vr_last);
        swap_int64(&vr_offset);
#endif
        if (vr_first < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid first record number in VXR record");
            return -1;
        }
        if (vr_last < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid last record number in VXR record");
            return -1;
        }
        if (vr_offset < 0 || vr_offset >= product_file->file_size)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VR record");
            return -1;
        }
        if (read_VR(product_file, variable, vr_offset, vr_first, vr_last) != 0)
        {
            return -1;
        }
    }

    if (read_VXR(product_file, variable, vxr_next, first, last) != 0)
    {
        return -1;
    }

    return 0;
}